

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterTable.h
# Opt level: O2

ion_err_t __thiscall
MasterTable::openDictionary<int,int>
          (MasterTable *this,Dictionary<int,_int> *dictionary,ion_dictionary_id_t id)

{
  ion_err_t iVar1;
  ion_err_t iVar2;
  int iVar3;
  int __oflag;
  MasterTable *__file;
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t local_30;
  
  iVar1 = ion_lookup_in_master_table(id,&local_30);
  iVar2 = '\x12';
  if (iVar1 == '\0') {
    __file = this;
    iVar2 = ion_switch_handler(local_30.dictionary_type,&this->handler);
    if (iVar2 == '\0') {
      (dictionary->dict).handler = &this->handler;
      iVar3 = Dictionary<int,_int>::open(dictionary,(char *)__file,__oflag);
      iVar2 = (ion_err_t)iVar3;
    }
  }
  return iVar2;
}

Assistant:

ion_err_t
openDictionary(
	Dictionary<K, V>	*dictionary,
	ion_dictionary_id_t id
) {
	ion_err_t						err;
	ion_dictionary_config_info_t	config;

	err = ion_lookup_in_master_table(id, &config);

	/* Lookup for id failed. */
	if (err_ok != err) {
		return err_uninitialized;
	}

	err = ion_switch_handler(config.dictionary_type, &handler);

	if (err_ok != err) {
		return err;
	}

	dictionary->dict.handler	= &handler;

	err							= dictionary->open(config);

	return err;
}